

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalAvg
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _func_int **pp_Var3;
  byte bVar4;
  reference this_00;
  pointer pEVar5;
  reference pvVar6;
  undefined8 *puVar7;
  hugeint_t input;
  LogicalType decimal_type;
  double result;
  LogicalType local_160;
  AggregateFunction local_148;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  LogicalType::LogicalType(&local_160,&pEVar5->return_type);
  GetAverageAggregate(&local_148,local_160.physical_type_);
  AggregateFunction::operator=(function,&local_148);
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02433f70;
  if (local_148.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_148.super_BaseScalarFunction);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name,0
             ,(char *)(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                      _M_string_length,0x1db294b);
  pvVar6 = vector<duckdb::LogicalType,_true>::operator[]
                     (&(function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  if (pvVar6 != &local_160) {
    pvVar6->id_ = local_160.id_;
    pvVar6->physical_type_ = local_160.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pvVar6->type_info_,&local_160.type_info_);
  }
  LogicalType::LogicalType((LogicalType *)&local_148,DOUBLE);
  (function->super_BaseScalarFunction).return_type.id_ =
       (LogicalTypeId)
       local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  (function->super_BaseScalarFunction).return_type.physical_type_ =
       local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function._1_1_;
  peVar1 = (function->super_BaseScalarFunction).return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (function->super_BaseScalarFunction).return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus._M_p;
  (function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_string_length;
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus._M_p =
       (pointer)peVar1;
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_string_length =
       (size_type)p_Var2;
  LogicalType::~LogicalType((LogicalType *)&local_148);
  bVar4 = DecimalType::GetScale(&local_160);
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)0x0;
  input.upper = (int64_t)&local_148;
  input.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + (ulong)bVar4 * 0x10 + 8);
  Hugeint::TryCast<double>
            (*(Hugeint **)(Hugeint::POWERS_OF_TEN + (ulong)bVar4 * 0x10),input,
             (double *)Hugeint::POWERS_OF_TEN);
  pp_Var3 = local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  puVar7 = (undefined8 *)operator_new(0x10);
  *puVar7 = &PTR__FunctionData_02479a00;
  puVar7[1] = pp_Var3;
  *(undefined8 **)this = puVar7;
  LogicalType::~LogicalType(&local_160);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindDecimalAvg(ClientContext &context, AggregateFunction &function,
                                        vector<unique_ptr<Expression>> &arguments) {
	auto decimal_type = arguments[0]->return_type;
	function = GetAverageAggregate(decimal_type.InternalType());
	function.name = "avg";
	function.arguments[0] = decimal_type;
	function.return_type = LogicalType::DOUBLE;
	return make_uniq<AverageDecimalBindData>(
	    Hugeint::Cast<double>(Hugeint::POWERS_OF_TEN[DecimalType::GetScale(decimal_type)]));
}